

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_helper.c
# Opt level: O0

void helper_pcistg(CPUS390XState_conflict *env,uint32_t r1,uint32_t r2)

{
  uint32_t r2_local;
  uint32_t r1_local;
  CPUS390XState_conflict *env_local;
  
  return;
}

Assistant:

void HELPER(pcistg)(CPUS390XState *env, uint32_t r1, uint32_t r2)
{
#if 0
    S390CPU *cpu = env_archcpu(env);

    qemu_mutex_lock_iothread();
    pcistg_service_call(cpu, r1, r2, GETPC());
    qemu_mutex_unlock_iothread();
#endif
}